

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbsColscale(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *__return_storage_ptr__,
                SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  DataArray<int> *pDVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pDVar1 = this->m_activeColscaleExp;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < pDVar1->thesize) {
    lVar3 = 0;
    do {
      dVar4 = ldexp(1.0,pDVar1->data[lVar3]);
      if ((!NAN(dVar4)) && ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,ABS(dVar4));
        iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&__return_storage_ptr__->m_backend,&local_68);
        if (iVar2 < 0) {
          dVar4 = ldexp(1.0,pDVar1->data[lVar3]);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,ABS(dVar4));
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pDVar1->thesize);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R maxi = 0.0;

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) > maxi)
         maxi = spxAbs(spxLdexp(1.0, colscaleExp[i]));


   return maxi;
}